

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O2

string * __thiscall
cmLinkLineComputer::ComputeLinkPath
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli,
          string *libPathFlag,string *libPathTerminator)

{
  pointer pIVar1;
  cmGeneratorTarget *pcVar2;
  pointer pbVar3;
  bool bVar4;
  TargetType TVar5;
  ItemVector *pIVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  ArtifactType artifact;
  pointer input;
  pointer pIVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_d0,(string *)&cli->LinkLanguage);
  bVar4 = std::operator==(&local_d0,"Swift");
  std::__cxx11::string::~string((string *)&local_d0);
  if (bVar4) {
    pIVar6 = cmComputeLinkInformation::GetItems(cli);
    pIVar1 = (pIVar6->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pIVar8 = (pIVar6->
                  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                  )._M_impl.super__Vector_impl_data._M_start; pIVar8 != pIVar1; pIVar8 = pIVar8 + 1)
    {
      pcVar2 = pIVar8->Target;
      if (pcVar2 != (cmGeneratorTarget *)0x0) {
        TVar5 = cmGeneratorTarget::GetType(pcVar2);
        if (TVar5 != STATIC_LIBRARY) {
          TVar5 = cmGeneratorTarget::GetType(pcVar2);
          if (TVar5 != SHARED_LIBRARY) goto LAB_00187fbb;
        }
        TVar5 = cmGeneratorTarget::GetType(pcVar2);
        artifact = RuntimeBinaryArtifact;
        if (TVar5 == SHARED_LIBRARY) {
          bVar4 = cmGeneratorTarget::IsDLLPlatform(pcVar2);
          artifact = (ArtifactType)bVar4;
        }
        std::operator+(&local_f0," ",libPathFlag);
        pcVar2 = pIVar8->Target;
        std::__cxx11::string::string((string *)&local_50,(string *)&cli->Config);
        cmGeneratorTarget::GetDirectory(&local_70,pcVar2,&local_50,artifact);
        std::operator+(&local_b0,&local_f0,&local_70);
        std::operator+(&local_90,&local_b0,libPathTerminator);
        std::operator+(&local_d0,&local_90," ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_f0);
      }
LAB_00187fbb:
    }
  }
  pvVar7 = cmComputeLinkInformation::GetDirectories_abi_cxx11_(cli);
  pbVar3 = (pvVar7->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (input = (pvVar7->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; input != pbVar3; input = input + 1) {
    std::operator+(&local_f0," ",libPathFlag);
    ConvertToOutputForExisting(&local_70,this,input);
    std::operator+(&local_b0,&local_f0,&local_70);
    std::operator+(&local_90,&local_b0,libPathTerminator);
    std::operator+(&local_d0,&local_90," ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkPath(
  cmComputeLinkInformation& cli, std::string const& libPathFlag,
  std::string const& libPathTerminator)
{
  std::string linkPath;

  if (cli.GetLinkLanguage() == "Swift") {
    for (const cmComputeLinkInformation::Item& item : cli.GetItems()) {
      const cmGeneratorTarget* target = item.Target;
      if (!target) {
        continue;
      }

      if (target->GetType() == cmStateEnums::STATIC_LIBRARY ||
          target->GetType() == cmStateEnums::SHARED_LIBRARY) {
        cmStateEnums::ArtifactType type = cmStateEnums::RuntimeBinaryArtifact;
        if (target->GetType() == cmStateEnums::SHARED_LIBRARY &&
            target->IsDLLPlatform()) {
          type = cmStateEnums::ImportLibraryArtifact;
        }

        linkPath += " " + libPathFlag +
          item.Target->GetDirectory(cli.GetConfig(), type) +
          libPathTerminator + " ";
      }
    }
  }

  for (std::string const& libDir : cli.GetDirectories()) {
    linkPath += " " + libPathFlag + this->ConvertToOutputForExisting(libDir) +
      libPathTerminator + " ";
  }

  return linkPath;
}